

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O1

void obx::anon_unknown_3::cCallbackTrampolineAsyncTreeGet
               (obx_err status,obx_id id,char *path,void *leaf_data,size_t leaf_data_size,
               void *leaf_metadata,size_t leaf_metadata_size,void *userData)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  string errorMessage;
  AsyncTreeGetResult result;
  allocator local_c9;
  _Any_data *local_c8;
  string local_c0;
  AsyncTreeGetResult local_a0;
  
  if (userData == (void *)0x0) {
    __assert_fail("userData",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/objectbox[P]objectbox-ts-demo/build_O1/_deps/objectbox-download-src/include/objectbox.hpp"
                  ,0xd6c,
                  "void obx::(anonymous namespace)::cCallbackTrampolineAsyncTreeGet(obx_err, obx_id, const char *, const void *, size_t, const void *, size_t, void *)"
                 );
  }
  local_c8 = (_Any_data *)userData;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_allocated_capacity._0_4_ =
       local_c0.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  if (status != 0) {
    internal::appendLastErrorText(status,&local_c0);
  }
  std::__cxx11::string::string((string *)&local_a0,path,&local_c9);
  paVar2 = &local_a0.errorMessage.field_2;
  local_a0.leaf_metadata.size = leaf_metadata_size;
  paVar1 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == paVar1) {
    local_a0.errorMessage.field_2._8_4_ = local_c0.field_2._8_4_;
    local_a0.errorMessage.field_2._12_4_ = local_c0.field_2._12_4_;
    local_a0.errorMessage._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_a0.errorMessage._M_dataplus._M_p = local_c0._M_dataplus._M_p;
  }
  local_a0.errorMessage.field_2._M_allocated_capacity._4_4_ =
       local_c0.field_2._M_allocated_capacity._4_4_;
  local_a0.errorMessage.field_2._M_allocated_capacity._0_4_ =
       local_c0.field_2._M_allocated_capacity._0_4_;
  local_a0.errorMessage._M_string_length = local_c0._M_string_length;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_allocated_capacity._0_4_ =
       local_c0.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_a0.status = status;
  local_a0.id = id;
  local_a0.leaf_data.data = leaf_data;
  local_a0.leaf_data.size = leaf_data_size;
  local_a0.leaf_metadata.data = leaf_metadata;
  if (*(long *)(local_c8 + 1) != 0) {
    (**(code **)(local_c8->_M_pod_data + 0x18))(local_c8,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.errorMessage._M_dataplus._M_p != paVar2) {
      operator_delete(local_a0.errorMessage._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.path._M_dataplus._M_p != &local_a0.path.field_2) {
      operator_delete(local_a0.path._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if (local_c8 != (_Any_data *)0x0) {
      std::default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_>::operator()
                ((default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_> *)&local_c8
                 ,(function<void_(const_obx::AsyncTreeGetResult_&)> *)local_c8);
    }
    return;
  }
  uVar3 = std::__throw_bad_function_call();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_c8 != (_Any_data *)0x0) {
    std::default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_>::operator()
              ((default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_> *)&local_c8,
               (function<void_(const_obx::AsyncTreeGetResult_&)> *)local_c8);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

void cCallbackTrampolineAsyncTreeGet(obx_err status, obx_id id, const char* path, const void* leaf_data,
                                     size_t leaf_data_size, const void* leaf_metadata, size_t leaf_metadata_size,
                                     void* userData) {
    assert(userData);
    std::unique_ptr<AsyncTreeGetCallback> callback(static_cast<AsyncTreeGetCallback*>(userData));
    std::string errorMessage;
    if (status != OBX_SUCCESS) internal::appendLastErrorText(status, errorMessage);
    AsyncTreeGetResult result{
        path, status, id, {leaf_data, leaf_data_size}, {leaf_metadata, leaf_metadata_size}, std::move(errorMessage)};
    (*callback)(result);
}